

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *
parse_device_list(string *value)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  value_type *ppgVar5;
  invalid_argument *piVar6;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *in_RDI;
  ggml_backend_device *dev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *device;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dev_names;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *devices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  string local_90 [39];
  string *in_stack_ffffffffffffff98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  undefined8 local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  byte local_11;
  
  local_11 = 0;
  std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::vector
            ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)0x1ac501);
  ppgVar5 = stack0xffffffffffffff90;
  uVar1 = (ulong)stack0xffffffffffffff90 >> 0x38;
  string_split<std::__cxx11::string>(in_stack_ffffffffffffff98,(char)uVar1);
  stack0xffffffffffffff90 = ppgVar5;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  if (bVar2) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"no devices specified");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_30);
  if (sVar3 == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_30,0);
    in_stack_ffffffffffffff47 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (char *)in_stack_ffffffffffffff28);
    if ((bool)in_stack_ffffffffffffff47) {
      local_48 = 0;
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
                ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (value_type *)in_stack_ffffffffffffff28);
      goto LAB_001ac7cb;
    }
  }
  local_50 = &local_30;
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff28);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff28), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_58);
    uVar4 = std::__cxx11::string::c_str();
    ppgVar5 = (value_type *)ggml_backend_dev_by_name(uVar4);
    unique0x10000381 = ppgVar5;
    if ((ppgVar5 == (value_type *)0x0) ||
       (in_stack_ffffffffffffff34 = ggml_backend_dev_type(ppgVar5), in_stack_ffffffffffffff34 != 1))
    {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      uVar4 = std::__cxx11::string::c_str();
      string_format_abi_cxx11_((char *)local_90,"invalid device: %s",uVar4);
      std::invalid_argument::invalid_argument(piVar6,local_90);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
              ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),ppgVar5);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_58);
  }
  std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::push_back
            ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (value_type *)in_stack_ffffffffffffff28);
LAB_001ac7cb:
  local_11 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  if ((local_11 & 1) == 0) {
    std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::~vector
              ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  }
  return in_RDI;
}

Assistant:

static std::vector<ggml_backend_dev_t> parse_device_list(const std::string & value) {
    std::vector<ggml_backend_dev_t> devices;
    auto dev_names = string_split<std::string>(value, ',');
    if (dev_names.empty()) {
        throw std::invalid_argument("no devices specified");
    }
    if (dev_names.size() == 1 && dev_names[0] == "none") {
        devices.push_back(nullptr);
    } else {
        for (const auto & device : dev_names) {
            auto * dev = ggml_backend_dev_by_name(device.c_str());
            if (!dev || ggml_backend_dev_type(dev) != GGML_BACKEND_DEVICE_TYPE_GPU) {
                throw std::invalid_argument(string_format("invalid device: %s", device.c_str()));
            }
            devices.push_back(dev);
        }
        devices.push_back(nullptr);
    }
    return devices;
}